

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

SequenceRange __thiscall
slang::ast::SequenceRepetition::applyTo(SequenceRepetition *this,SequenceRange res)

{
  bool bVar1;
  optional<unsigned_int> oVar2;
  undefined1 in_DL;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar3;
  undefined8 in_RSI;
  optional<unsigned_int> *in_RDI;
  SequenceRange SVar4;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Storage<unsigned_int,_true> _Stack_18;
  bool local_14;
  
  _Stack_18._M_value = (uint)((ulong)in_RSI >> 0x20);
  checkedMulU32(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  SVar4.min = std::optional<unsigned_int>::value_or<unsigned_int>
                        (in_RDI,(uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ));
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x9a757a);
  if ((bVar1) &&
     (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x9a7592), bVar1)) {
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x9a75a6);
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x9a75be);
    oVar2 = checkedMulU32(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    _Stack_18._M_value =
         oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    local_14 = oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
    uVar3 = extraout_EDX;
  }
  else {
    std::optional<unsigned_int>::reset((optional<unsigned_int> *)0x9a75e8);
    uVar3 = extraout_EDX_00;
    local_14 = (bool)in_DL;
  }
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_18._M_value;
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._5_3_ = (undefined3)((uint)uVar3 >> 8);
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = local_14;
  return SVar4;
}

Assistant:

SequenceRange SequenceRepetition::applyTo(SequenceRange res) const {
    res.min = checkedMulU32(res.min, range.min).value_or(UINT32_MAX);
    if (res.max && range.max)
        res.max = checkedMulU32(*res.max, *range.max);
    else
        res.max.reset();

    return res;
}